

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

bool MeCab::Viterbi::initPartial(Lattice *lattice)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  vector<char_*,_std::allocator<char_*>_> *pvVar7;
  size_type sVar8;
  reference pvVar9;
  size_t sVar10;
  vector<char_*,_std::allocator<char_*>_> *in_RDI;
  pair<char_*,_char_*> pVar11;
  pair<char_*,_char_*> pVar12;
  size_t n;
  size_t len_1;
  char *feature;
  char *surface;
  size_t i_1;
  size_t len;
  size_t size;
  size_t i;
  size_t pos;
  vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_> tokens;
  StringBuffer os;
  scoped_array<char> buf;
  char *column [2];
  size_t lsize;
  vector<char_*,_std::allocator<char_*>_> lines;
  char *str;
  Allocator<mecab_node_t,_mecab_path_t> *allocator;
  undefined7 in_stack_fffffffffffffe18;
  char in_stack_fffffffffffffe1f;
  Allocator<mecab_node_t,_mecab_path_t> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe48;
  vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
  *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  back_insert_iterator<std::vector<char_*,_std::allocator<char_*>_>_> in_stack_fffffffffffffe60;
  ulong local_128;
  ulong local_108;
  size_type local_c8;
  long local_c0;
  undefined1 local_b8 [64];
  scoped_array<char> local_78;
  char *local_68;
  result_pair_type *local_48;
  size_t local_40;
  vector<char_*,_std::allocator<char_*>_> local_38;
  char *local_20;
  undefined8 local_18;
  vector<char_*,_std::allocator<char_*>_> *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  uVar2 = (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                       *)&in_RDI->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl).
                    super__Vector_impl_data._M_start[9].first)(in_RDI,4);
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                         *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl)
                      .super__Vector_impl_data._M_start[0xf].first)();
    if ((uVar2 & 1) != 0) {
      (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                   *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl).
                super__Vector_impl_data._M_start[0x10].second)(local_10,0,1);
      uVar3 = (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                           *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->
                        _M_impl).super__Vector_impl_data._M_start[5].second)();
      (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                   *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl).
                super__Vector_impl_data._M_start[0x10].second)(local_10,uVar3,1);
    }
    local_1 = 1;
  }
  else {
    local_18 = (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                            *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->
                         _M_impl).super__Vector_impl_data._M_start[0xb].first)();
    (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                 *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl).
              super__Vector_impl_data._M_start[5].second)();
    pcVar4 = Allocator<mecab_node_t,_mecab_path_t>::partial_buffer
                       (in_stack_fffffffffffffe20,
                        CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    local_20 = pcVar4;
    pcVar5 = (char *)(*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                                  *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)
                               ->_M_impl).super__Vector_impl_data._M_start[4].first)();
    lVar6 = (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                         *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl)
                      .super__Vector_impl_data._M_start[5].second)();
    strncpy(pcVar4,pcVar5,lVar6 + 1);
    std::vector<char_*,_std::allocator<char_*>_>::vector
              ((vector<char_*,_std::allocator<char_*>_> *)0x15cd80);
    local_48 = (result_pair_type *)
               std::back_inserter<std::vector<char*,std::allocator<char*>>>
                         ((vector<char_*,_std::allocator<char_*>_> *)
                          CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                 *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl).
              super__Vector_impl_data._M_start[5].second)();
    local_40 = tokenize<std::back_insert_iterator<std::vector<char*,std::allocator<char*>>>>
                         (in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
                          in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe48);
    lVar6 = (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                         *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl)
                      .super__Vector_impl_data._M_start[5].second)();
    pcVar4 = (char *)operator_new__(lVar6 + 1);
    scoped_array<char>::scoped_array(&local_78,pcVar4);
    pcVar4 = scoped_array<char>::get(&local_78);
    lVar6 = (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                         *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl)
                      .super__Vector_impl_data._M_start[5].second)();
    StringBuffer::StringBuffer((StringBuffer *)(local_b8 + 0x18),pcVar4,lVar6 + 1);
    std::vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>::vector
              ((vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_> *)
               0x15cea7);
    std::vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>::reserve
              (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
    pVar11.second = (char *)in_stack_fffffffffffffe50;
    pVar11.first = in_stack_fffffffffffffe58;
    for (local_c8 = 0; local_c8 < local_40; local_c8 = local_c8 + 1) {
      std::vector<char_*,_std::allocator<char_*>_>::operator[](&local_38,local_c8);
      pvVar7 = (vector<char_*,_std::allocator<char_*>_> *)
               tokenize<char**>((char *)in_stack_fffffffffffffe60.container,pVar11.first,
                                (char **)pVar11.second,(size_t)in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe60.container = pvVar7;
      if ((pvVar7 == (vector<char_*,_std::allocator<char_*>_> *)0x1) &&
         (iVar1 = strcmp(local_68,"EOS"), iVar1 == 0)) break;
      strlen(local_68);
      if (pvVar7 == (vector<char_*,_std::allocator<char_*>_> *)0x2) {
        pVar11 = std::make_pair<char*&,char*&>
                           ((char **)in_stack_fffffffffffffe20,
                            (char **)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        std::vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>::
        push_back((vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_> *)
                  in_stack_fffffffffffffe20,
                  (value_type *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
      }
      else {
        pVar12 = std::make_pair<char*&,char*>
                           ((char **)in_stack_fffffffffffffe20,
                            (char **)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        in_stack_fffffffffffffe48 = pVar12.first;
        std::vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>::
        push_back((vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_> *)
                  in_stack_fffffffffffffe20,
                  (value_type *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
      }
      StringBuffer::operator<<
                ((StringBuffer *)in_stack_fffffffffffffe20,
                 (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    }
    StringBuffer::operator<<((StringBuffer *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f);
    pvVar7 = local_10;
    pcVar4 = StringBuffer::str((StringBuffer *)(local_b8 + 0x18));
    (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                 *)&pvVar7->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl).
              super__Vector_impl_data._M_start[4].second)(pvVar7,pcVar4);
    local_c0 = 0;
    for (local_108 = 0;
        sVar8 = std::vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                ::size((vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                        *)local_b8), local_108 < sVar8; local_108 = local_108 + 1) {
      in_stack_fffffffffffffe20 = (Allocator<mecab_node_t,_mecab_path_t> *)local_b8;
      pvVar9 = std::vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>::
               operator[]((vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                           *)in_stack_fffffffffffffe20,local_108);
      pcVar4 = pvVar9->first;
      pvVar9 = std::vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>::
               operator[]((vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                           *)in_stack_fffffffffffffe20,local_108);
      pcVar5 = pvVar9->second;
      sVar10 = strlen(pcVar4);
      (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                   *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl).
                super__Vector_impl_data._M_start[0x10].second)(local_10,local_c0,1);
      (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                   *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl).
                super__Vector_impl_data._M_start[0x10].second)(local_10,local_c0 + sVar10,1);
      if (pcVar5 != (char *)0x0) {
        (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                     *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl).
                  super__Vector_impl_data._M_start[0x11].first)
                  (local_10,local_c0,local_c0 + sVar10,pcVar5);
        for (local_128 = 1; local_128 < sVar10; local_128 = local_128 + 1) {
          (*(code *)(((_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                       *)&local_10->super__Vector_base<char_*,_std::allocator<char_*>_>)->_M_impl).
                    super__Vector_impl_data._M_start[0x10].second)(local_10,local_c0 + local_128,2);
        }
      }
      local_c0 = sVar10 + local_c0;
    }
    local_1 = 1;
    std::vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>::~vector
              ((vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_> *)
               pvVar7);
    StringBuffer::~StringBuffer((StringBuffer *)in_stack_fffffffffffffe20);
    scoped_array<char>::~scoped_array((scoped_array<char> *)in_stack_fffffffffffffe20);
    std::vector<char_*,_std::allocator<char_*>_>::~vector(pvVar7);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Viterbi::initPartial(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_PARTIAL)) {
    if (lattice->has_constraint()) {
      lattice->set_boundary_constraint(0, MECAB_TOKEN_BOUNDARY);
      lattice->set_boundary_constraint(lattice->size(),
                                       MECAB_TOKEN_BOUNDARY);
    }
    return true;
  }

  Allocator<Node, Path> *allocator = lattice->allocator();
  char *str = allocator->partial_buffer(lattice->size() + 1);
  strncpy(str, lattice->sentence(), lattice->size() + 1);

  std::vector<char *> lines;
  const size_t lsize = tokenize(str, "\n",
                                std::back_inserter(lines),
                                lattice->size() + 1);
  char* column[2];
  scoped_array<char> buf(new char[lattice->size() + 1]);
  StringBuffer os(buf.get(), lattice->size() + 1);

  std::vector<std::pair<char *, char *> > tokens;
  tokens.reserve(lsize);

  size_t pos = 0;
  for (size_t i = 0; i < lsize; ++i) {
    const size_t size = tokenize(lines[i], "\t", column, 2);
    if (size == 1 && std::strcmp(column[0], "EOS") == 0) {
      break;
    }
    const size_t len = std::strlen(column[0]);
    if (size == 2) {
      tokens.push_back(std::make_pair(column[0], column[1]));
    } else {
      tokens.push_back(std::make_pair(column[0], reinterpret_cast<char *>(0)));
    }
    os << column[0];
    pos += len;
  }

  os << '\0';

  lattice->set_sentence(os.str());

  pos = 0;
  for (size_t i = 0; i < tokens.size(); ++i) {
    const char *surface = tokens[i].first;
    const char *feature = tokens[i].second;
    const size_t len = std::strlen(surface);
    lattice->set_boundary_constraint(pos, MECAB_TOKEN_BOUNDARY);
    lattice->set_boundary_constraint(pos + len, MECAB_TOKEN_BOUNDARY);
    if (feature) {
      lattice->set_feature_constraint(pos, pos + len, feature);
      for (size_t n = 1; n < len; ++n) {
        lattice->set_boundary_constraint(pos + n,
                                         MECAB_INSIDE_TOKEN);
      }
    }
    pos += len;
  }

  return true;
}